

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O0

TermList __thiscall Parse::SMTLIB2::ParseResult::asTerm(ParseResult *this,TermList *resTrm)

{
  undefined8 *in_RSI;
  Term *in_RDI;
  TermList *in_stack_ffffffffffffffe0;
  _func_int **local_8;
  
  if (((byte)((string *)&in_RDI->_functor)->_M_dataplus & 1) == 0) {
    *in_RSI = *(undefined8 *)&in_RDI[1]._vptr_Term;
    local_8 = in_RDI->_vptr_Term;
  }
  else {
    Kernel::Term::createFormula((Formula *)in_RDI);
    Kernel::TermList::TermList(in_stack_ffffffffffffffe0,in_RDI);
    *in_RSI = in_stack_ffffffffffffffe0;
    local_8 = (_func_int **)Kernel::AtomicSort::boolSort();
  }
  return (TermList)(uint64_t)local_8;
}

Assistant:

TermList SMTLIB2::ParseResult::asTerm(TermList& resTrm)
{
  if (formula) {
    ASS_EQ(sort, AtomicSort::boolSort());

    LOG2("asTerm wrap ",frm->toString());

    resTrm = TermList(Term::createFormula(frm));

    LOG2("asTerm sort ",sort);
    return AtomicSort::boolSort();
  } else {
    resTrm = trm;

    LOG2("asTerm native ",trm.toString());

    LOG2("asTerm sort ",sort);

    return sort;
  }
}